

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

SamePadding * __thiscall CoreML::Specification::SamePadding::New(SamePadding *this,Arena *arena)

{
  SamePadding *this_00;
  
  this_00 = (SamePadding *)operator_new(0x18);
  SamePadding(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SamePadding>(arena,this_00);
  }
  return this_00;
}

Assistant:

SamePadding* SamePadding::New(::google::protobuf::Arena* arena) const {
  SamePadding* n = new SamePadding;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}